

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.cpp
# Opt level: O1

symbolEncodingType_e
duckdb_zstd::ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  byte bVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  BYTE wksp [512];
  short local_2a8 [56];
  undefined1 local_238 [520];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < nbSeq || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  bVar7 = (byte)defaultNormLog;
  if ((int)strategy < 4) {
    if (isDefaultAllowed == ZSTD_defaultDisallowed) goto LAB_01936de8;
    if ((nbSeq < 1000) && (*repeatMode == FSE_repeat_valid)) {
      bVar2 = false;
      goto LAB_01936db6;
    }
    if ((nbSeq < ((ulong)(10 - strategy) << (bVar7 & 0x3f)) >> 3) ||
       (mostFrequent < nbSeq >> (bVar7 - 1 & 0x3f))) goto LAB_01936dda;
    bVar2 = true;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    uVar11 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        sVar8 = defaultNorm[uVar10];
        if (defaultNorm[uVar10] == -1) {
          sVar8 = 1;
        }
        uVar11 = uVar11 + *(int *)(kInverseProbabilityLog256 +
                                  (ulong)(uint)((int)sVar8 << (8 - bVar7 & 0x1f)) * 4) *
                          count[uVar10];
        uVar10 = uVar10 + 1;
      } while (max + 1 + (uint)(max == 0xffffffff) != uVar10);
      uVar11 = uVar11 >> 8;
    }
    if (*repeatMode != FSE_repeat_none) {
      uVar4 = ZSTD_fseBitCost(prevCTable,count,max);
    }
    uVar3 = FSE_optimalTableLog(FSELog,nbSeq,max);
    sVar5 = FSE_normalizeCount(local_2a8,uVar3,count,nbSeq,max,(uint)(0x7ff < nbSeq));
    if (sVar5 < 0xffffffffffffff89) {
      sVar5 = FSE_writeNCount(local_238,0x200,local_2a8,max,uVar3);
    }
    uVar10 = 0;
    uVar3 = 0;
    do {
      uVar1 = count[uVar10];
      uVar6 = (uVar1 << 8) / nbSeq;
      uVar9 = uVar6;
      if (uVar1 << 8 < nbSeq) {
        uVar9 = 1;
      }
      if (uVar1 == 0) {
        uVar9 = uVar6;
      }
      uVar3 = uVar3 + uVar1 * *(int *)(kInverseProbabilityLog256 + uVar9 * 4);
      uVar10 = uVar10 + 1;
    } while (max + 1 + (uint)(max == 0xffffffff) != uVar10);
    uVar10 = (ulong)(uVar3 >> 8) + sVar5 * 8;
    if ((uVar4 < uVar11) || (uVar10 < uVar11)) {
      bVar2 = uVar10 < uVar4;
LAB_01936db6:
      mostFrequent = 3;
    }
    else {
LAB_01936dda:
      *repeatMode = FSE_repeat_none;
      bVar2 = false;
      mostFrequent = 0;
    }
  }
  if (!bVar2) {
    return (symbolEncodingType_e)mostFrequent;
  }
LAB_01936de8:
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or fewer symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}